

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::record::IntegerBase<4u,11u>::print<std::back_insert_iterator<std::__cxx11::string>>
          (IntegerBase<4u,11u> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  int value;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_40 = *(uint *)this;
  local_3c = MT;
  local_38 = MF;
  local_34 = MAT;
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  local_40 = *(uint *)(this + 4);
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  std::__cxx11::string::push_back((char)it->container);
  puVar2 = *(uint **)(this + 8);
  puVar1 = *(uint **)(this + 0x10);
  puVar4 = puVar2;
  if (puVar2 != puVar1) {
    do {
      local_40 = *puVar2;
      tools::disco::Integer<5u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
                ((int *)&local_40,it);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    puVar2 = *(uint **)(this + 0x10);
    puVar4 = *(uint **)(this + 8);
  }
  iVar3 = (int)((ulong)((long)puVar2 - (long)puVar4) >> 2);
  if (iVar3 != 0xb) {
    iVar3 = 0xb - iVar3;
    do {
      iVar5 = 5;
      do {
        std::__cxx11::string::push_back((char)it->container);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  tools::disco::
  Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
            (it,&local_34,&local_38,&local_3c);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;

  record::Integer< 5 >::Parser::write( this->I(), it );
  record::Integer< 5 >::Parser::write( this->J(), it );

  if ( NDIGIT != 6 ) { disco::Column< 1 >::write( it ); };

  for ( auto value : this->K() ) {

    record::Integer< NDIGIT + 1 >::Parser::write( value, it );
  }

  switch ( NDIGIT ) {

    case 2: { disco::Column< 1 >::write( it ); break; }
    case 3: { disco::Column< 3 >::write( it ); break; }
    case 5: { disco::Column< 1 >::write( it ); break; }
    default: { /* unreachable */ break; }
  }

  int blankEntries = N - this->K().size();
  while ( blankEntries-- ){ disco::Column< NDIGIT + 1 >::write( it ); }

  using Format =
    disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                   disco::Integer< 3 >, disco::Column< 5 > >;

  Format::write( it, MAT, MF, MT );
}